

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalStorage::Flush
          (LocalStorage *this,DataTable *table,LocalTableStorage *storage,
          optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  shared_ptr<duckdb::RowGroupCollection,_true> *this_00;
  ulong uVar1;
  DuckTransaction *this_01;
  bool bVar2;
  RowGroupCollection *pRVar3;
  idx_t iVar4;
  idx_t iVar5;
  unsigned_long start_row;
  type data;
  TableIndexList *extraout_RDX;
  TableAppendState append_state;
  
  if (storage->is_dropped != false) {
    return;
  }
  this_00 = &storage->row_groups;
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
  iVar4 = RowGroupCollection::GetTotalRows(pRVar3);
  if (iVar4 <= storage->deleted_rows) {
    LocalTableStorage::Rollback(storage);
    return;
  }
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
  iVar5 = RowGroupCollection::GetTotalRows(pRVar3);
  iVar4 = storage->deleted_rows;
  DataTable::InitializeIndexes(table,this->context);
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
  uVar1 = pRVar3->row_group_size;
  TableAppendState::TableAppendState(&append_state);
  DataTable::AppendLock(table,&append_state);
  this_01 = this->transaction;
  start_row = NumericCastImpl<unsigned_long,_long,_false>::Convert(append_state.row_start);
  DuckTransaction::PushAppend(this_01,table,start_row,iVar5 - iVar4);
  if (append_state.row_start == 0) {
LAB_01583b82:
    if (storage->deleted_rows == 0) {
      LocalTableStorage::FlushBlocks(storage);
      bVar2 = DataTable::HasIndexes(table);
      if (bVar2) {
        LocalTableStorage::AppendToIndexes(storage,this->transaction,&append_state,false);
      }
      data = shared_ptr<duckdb::RowGroupCollection,_true>::operator*(this_00);
      DataTable::MergeStorage(table,data,extraout_RDX,commit_state);
      goto LAB_01583c02;
    }
  }
  else {
    pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
    iVar4 = RowGroupCollection::GetTotalRows(pRVar3);
    if (uVar1 <= iVar4) goto LAB_01583b82;
  }
  LocalTableStorage::Rollback(storage);
  LocalTableStorage::AppendToIndexes(storage,this->transaction,&append_state,true);
LAB_01583c02:
  TableAppendState::~TableAppendState(&append_state);
  return;
}

Assistant:

void LocalStorage::Flush(DataTable &table, LocalTableStorage &storage, optional_ptr<StorageCommitState> commit_state) {
	if (storage.is_dropped) {
		return;
	}
	if (storage.row_groups->GetTotalRows() <= storage.deleted_rows) {
		// all rows that we added were deleted
		// rollback any partial blocks that are still outstanding
		storage.Rollback();
		return;
	}
	idx_t append_count = storage.row_groups->GetTotalRows() - storage.deleted_rows;
	table.InitializeIndexes(context);

	const idx_t row_group_size = storage.row_groups->GetRowGroupSize();

	TableAppendState append_state;
	table.AppendLock(append_state);
	transaction.PushAppend(table, NumericCast<idx_t>(append_state.row_start), append_count);
	if ((append_state.row_start == 0 || storage.row_groups->GetTotalRows() >= row_group_size) &&
	    storage.deleted_rows == 0) {
		// table is currently empty OR we are bulk appending: move over the storage directly
		// first flush any outstanding blocks
		storage.FlushBlocks();
		// now append to the indexes (if there are any)
		// FIXME: we should be able to merge the transaction-local index directly into the main table index
		// as long we just rewrite some row-ids
		if (table.HasIndexes()) {
			storage.AppendToIndexes(transaction, append_state, false);
		}
		// finally move over the row groups
		table.MergeStorage(*storage.row_groups, storage.append_indexes, commit_state);
	} else {
		// check if we have written data
		// if we have, we cannot merge to disk after all
		// so we need to revert the data we have already written
		storage.Rollback();
		// append to the indexes and append to the base table
		storage.AppendToIndexes(transaction, append_state, true);
	}

#ifdef DEBUG
	// Verify that our index memory is stable.
	table.VerifyIndexBuffers();
#endif
}